

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsConnection.cpp
# Opt level: O1

long __thiscall
AmsConnection::DeleteNotification
          (AmsConnection *this,AmsAddr *amsAddr,uint32_t hNotify,uint32_t tmms,uint16_t port)

{
  long lVar1;
  uint32_t local_7c;
  AmsRequest local_78;
  
  Frame::Frame(&local_78.frame,0x2a,(void *)0x0);
  local_78.cmdId = 7;
  local_78._44_8_ = 0;
  local_78.buffer._4_4_ = 0;
  local_78.bytesRead._0_4_ = 0;
  local_78.bytesRead._4_4_ = 0;
  local_78.deadline.__d.__r = (duration)0;
  local_7c = hNotify;
  local_78.destAddr = amsAddr;
  local_78.port = port;
  Frame::prepend(&local_78.frame,&local_7c,4);
  lVar1 = AdsRequest(this,&local_78,tmms);
  if ((_Head_base<0UL,_unsigned_char_*,_false>)
      local_78.frame.m_Data._M_t.
      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
      (_Head_base<0UL,_unsigned_char_*,_false>)0x0) {
    operator_delete__((void *)local_78.frame.m_Data._M_t.
                              super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                              .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
  }
  return lVar1;
}

Assistant:

long AmsConnection::DeleteNotification(const AmsAddr& amsAddr, uint32_t hNotify, uint32_t tmms, uint16_t port)
{
    AmsRequest request {
        amsAddr,
        port, AoEHeader::DEL_DEVICE_NOTIFICATION,
        0, nullptr, nullptr,
        sizeof(hNotify)
    };
    request.frame.prepend(bhf::ads::htole(hNotify));
    return AdsRequest(request, tmms);
}